

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::free(Image *this,void *__ptr)

{
  Image *this_local;
  
  if ((this->flags & 1U) != 0) {
    (*DAT_00168638)(this->pixels);
    this->pixels = (uint8 *)0x0;
  }
  if ((this->flags & 2U) != 0) {
    (*DAT_00168638)(this->palette);
    this->palette = (uint8 *)0x0;
  }
  this->flags = 0;
  return;
}

Assistant:

void
Image::free(void)
{
	if(this->flags&1){
		rwFree(this->pixels);
		this->pixels = nil;
	}
	if(this->flags&2){
		rwFree(this->palette);
		this->palette = nil;
	}
	this->flags = 0;
}